

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

void initialize_global_cpu_info(void)

{
  CpuSet *in_stack_00000060;
  CpuSet *in_stack_00000068;
  CpuSet *in_stack_00000070;
  
  g_cpucount = get_cpucount();
  g_physical_cpucount = get_physical_cpucount();
  g_powersave = 0;
  initialize_cpu_thread_affinity_mask(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  g_hwcaps = get_elf_hwcap(0);
  g_hwcaps2 = get_elf_hwcap(0);
  g_cpu_support_x86_avx = get_cpu_support_x86_avx();
  g_cpu_support_x86_fma = get_cpu_support_x86_fma();
  g_cpu_support_x86_xop = get_cpu_support_x86_xop();
  g_cpu_support_x86_f16c = get_cpu_support_x86_f16c();
  g_cpu_support_x86_avx2 = get_cpu_support_x86_avx2();
  g_cpu_support_x86_avx_vnni = get_cpu_support_x86_avx_vnni();
  g_cpu_support_x86_avx512 = get_cpu_support_x86_avx512();
  g_cpu_support_x86_avx512_vnni = get_cpu_support_x86_avx512_vnni();
  g_cpu_support_x86_avx512_bf16 = get_cpu_support_x86_avx512_bf16();
  g_cpu_support_x86_avx512_fp16 = get_cpu_support_x86_avx512_fp16();
  g_cpu_level2_cachesize = get_cpu_level2_cachesize();
  g_cpu_level3_cachesize = get_cpu_level3_cachesize();
  return;
}

Assistant:

static void initialize_global_cpu_info()
{
    g_cpucount = get_cpucount();
    g_physical_cpucount = get_physical_cpucount();
    g_powersave = 0;
    initialize_cpu_thread_affinity_mask(g_cpu_affinity_mask_all, g_cpu_affinity_mask_little, g_cpu_affinity_mask_big);

#if defined __ANDROID__ || defined __linux__
    g_hwcaps = get_elf_hwcap(AT_HWCAP);
    g_hwcaps2 = get_elf_hwcap(AT_HWCAP2);
#endif // defined __ANDROID__ || defined __linux__

#if __APPLE__
    g_hw_cpufamily = get_hw_cpufamily();
    g_hw_cputype = get_hw_cputype();
    g_hw_cpusubtype = get_hw_cpusubtype();

    g_hw_optional_arm_FEAT_FP16 = get_hw_capability("hw.optional.arm.FEAT_FP16");
    g_hw_optional_arm_FEAT_DotProd = get_hw_capability("hw.optional.arm.FEAT_DotProd");
    g_hw_optional_arm_FEAT_FHM = get_hw_capability("hw.optional.arm.FEAT_FHM");
    g_hw_optional_arm_FEAT_BF16 = get_hw_capability("hw.optional.arm.FEAT_BF16");
    g_hw_optional_arm_FEAT_I8MM = get_hw_capability("hw.optional.arm.FEAT_I8MM");
#endif // __APPLE__

#if defined(__i386__) || defined(__x86_64__) || defined(_M_IX86) || defined(_M_X64)
    g_cpu_support_x86_avx = get_cpu_support_x86_avx();
    g_cpu_support_x86_fma = get_cpu_support_x86_fma();
    g_cpu_support_x86_xop = get_cpu_support_x86_xop();
    g_cpu_support_x86_f16c = get_cpu_support_x86_f16c();
    g_cpu_support_x86_avx2 = get_cpu_support_x86_avx2();
    g_cpu_support_x86_avx_vnni = get_cpu_support_x86_avx_vnni();
    g_cpu_support_x86_avx512 = get_cpu_support_x86_avx512();
    g_cpu_support_x86_avx512_vnni = get_cpu_support_x86_avx512_vnni();
    g_cpu_support_x86_avx512_bf16 = get_cpu_support_x86_avx512_bf16();
    g_cpu_support_x86_avx512_fp16 = get_cpu_support_x86_avx512_fp16();
#endif // defined(__i386__) || defined(__x86_64__) || defined(_M_IX86) || defined(_M_X64)

    g_cpu_level2_cachesize = get_cpu_level2_cachesize();
    g_cpu_level3_cachesize = get_cpu_level3_cachesize();

#if defined __ANDROID__ || defined __linux__
#if __aarch64__
    g_cpu_is_arm_a53_a55 = detect_cpu_is_arm_a53_a55();
#endif // __aarch64__
#endif // defined __ANDROID__ || defined __linux__
}